

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

int Abc_NtkIsAcyclicWithBoxes(Abc_Ntk_t *pNtk)

{
  long *plVar1;
  FILE *__stream;
  int iVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  int iVar5;
  
  Abc_NtkIncrementTravId(pNtk);
  Abc_NtkIncrementTravId(pNtk);
  for (iVar5 = 0; iVar5 < pNtk->vPos->nSize; iVar5 = iVar5 + 1) {
    pAVar3 = Abc_NtkPo(pNtk,iVar5);
    pAVar3 = Abc_ObjFanin0Ntk((Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray]);
    if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 5) {
      pAVar3 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
    }
    iVar2 = Abc_NodeIsTravIdPrevious(pAVar3);
    if ((iVar2 == 0) && (iVar2 = Abc_NtkIsAcyclicWithBoxes_rec(pAVar3), iVar2 == 0))
    goto LAB_001c80d9;
  }
  iVar5 = 0;
  do {
    if (pNtk->vBoxes->nSize <= iVar5) {
      return 1;
    }
    pAVar3 = Abc_NtkBox(pNtk,iVar5);
    if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 8) {
      pAVar3 = Abc_NtkBox(pNtk,iVar5);
      plVar1 = (long *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
      pAVar3 = Abc_ObjFanin0Ntk(*(Abc_Obj_t **)
                                 (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                 (long)*(int *)plVar1[4] * 8));
      if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 5) {
        pAVar3 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
      }
      iVar2 = Abc_NodeIsTravIdPrevious(pAVar3);
      if ((iVar2 == 0) && (iVar2 = Abc_NtkIsAcyclicWithBoxes_rec(pAVar3), iVar2 == 0)) {
LAB_001c80d9:
        __stream = _stdout;
        pcVar4 = Abc_ObjName((Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray]);
        fprintf(__stream," PO \"%s\"\n",pcVar4);
        return 0;
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

int Abc_NtkIsAcyclicWithBoxes( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int fAcyclic;
    int i;
    // set the traversal ID for this DFS ordering
    Abc_NtkIncrementTravId( pNtk );   
    Abc_NtkIncrementTravId( pNtk );   
    // pNode->TravId == pNet->nTravIds      means "pNode is on the path"
    // pNode->TravId == pNet->nTravIds - 1  means "pNode is visited but is not on the path"
    // pNode->TravId <  pNet->nTravIds - 1  means "pNode is not visited"
    // traverse the network to detect cycles
    fAcyclic = 1;
    Abc_NtkForEachPo( pNtk, pNode, i )
    {
        pNode = Abc_ObjFanin0Ntk(Abc_ObjFanin0(pNode));
        if ( Abc_ObjIsBo(pNode) )
            pNode = Abc_ObjFanin0(pNode);
        if ( Abc_NodeIsTravIdPrevious(pNode) )
            continue;
        // traverse the output logic cone
        if ( (fAcyclic = Abc_NtkIsAcyclicWithBoxes_rec(pNode)) )
            continue;
        // stop as soon as the first loop is detected
        fprintf( stdout, " PO \"%s\"\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        break;
    }
    if ( fAcyclic )
    {
        Abc_NtkForEachLatchInput( pNtk, pNode, i )
        {
            pNode = Abc_ObjFanin0Ntk(Abc_ObjFanin0(pNode));
            if ( Abc_ObjIsBo(pNode) )
                pNode = Abc_ObjFanin0(pNode);
            if ( Abc_NodeIsTravIdPrevious(pNode) )
                continue;
            // traverse the output logic cone
            if ( (fAcyclic = Abc_NtkIsAcyclicWithBoxes_rec(pNode)) )
                continue;
            // stop as soon as the first loop is detected
            fprintf( stdout, " PO \"%s\"\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            break;
        }
    }
    return fAcyclic;
}